

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_auxv.c
# Opt level: O0

link_map * get_vdso_from_aliases(void)

{
  int iVar1;
  char **local_20;
  char **aliases;
  link_map *m;
  
  aliases = ___throw_regex_error;
  do {
    if (aliases == (char **)0x0) {
      return (link_map *)0x0;
    }
    for (local_20 = vdso_aliases; *local_20 != (char *)0x0; local_20 = local_20 + 1) {
      if ((aliases[1] != (char *)0x0) && (iVar1 = strcmp(aliases[1],*local_20), iVar1 == 0)) {
        return (link_map *)aliases;
      }
    }
    aliases = (char **)aliases[3];
  } while( true );
}

Assistant:

struct link_map *get_vdso_from_aliases() {
  struct link_map *m = NULL;
  char **aliases = NULL;

  for (m = _r_debug.r_map; m; m = m->l_next) {
    for (aliases = vdso_aliases; *aliases; aliases++) {
      if (m->l_name && gotcha_strcmp(m->l_name, *aliases) == 0) {
        return m;  // GCOVR_EXCL_LINE
      }
    }
  }
  return NULL;
}